

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.cpp
# Opt level: O0

void __thiscall
Integer_MaxPossibleNumber_Test::~Integer_MaxPossibleNumber_Test
          (Integer_MaxPossibleNumber_Test *this)

{
  Integer_MaxPossibleNumber_Test *this_local;
  
  ~Integer_MaxPossibleNumber_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Integer, MaxPossibleNumber) {
    std::istringstream input("key = 9223372036854775807");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, std::numeric_limits<int64_t>::max()},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}